

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testXMLSafe.cxx
# Opt level: O0

int testXMLSafe(int param_1,char **param_2)

{
  undefined8 uVar1;
  bool bVar2;
  undefined8 uVar3;
  undefined1 local_1e8 [8];
  string out;
  ostringstream local_1b8 [8];
  ostringstream oss;
  undefined1 local_40 [8];
  cmXMLSafe xs;
  test_pair *p;
  int result;
  char **param_1_local;
  int param_0_local;
  
  p._4_4_ = 0;
  for (xs._16_8_ = pairs; *(long *)xs._16_8_ != 0; xs._16_8_ = xs._16_8_ + 0x10) {
    cmXMLSafe::cmXMLSafe((cmXMLSafe *)local_40,*(char **)xs._16_8_);
    std::__cxx11::ostringstream::ostringstream(local_1b8);
    operator<<((ostream *)local_1b8,(cmXMLSafe *)local_40);
    std::__cxx11::ostringstream::str();
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_1e8,*(char **)(xs._16_8_ + 8));
    if (bVar2) {
      uVar1 = *(undefined8 *)(xs._16_8_ + 8);
      uVar3 = std::__cxx11::string::c_str();
      printf("expected [%s], got [%s]\n",uVar1,uVar3);
      p._4_4_ = 1;
    }
    std::__cxx11::string::~string((string *)local_1e8);
    std::__cxx11::ostringstream::~ostringstream(local_1b8);
  }
  return p._4_4_;
}

Assistant:

int testXMLSafe(int, char*[])
{
  int result = 0;
  for(test_pair const* p = pairs; p->in; ++p)
    {
    cmXMLSafe xs(p->in);
    std::ostringstream oss;
    oss << xs;
    std::string out = oss.str();
    if(out != p->out)
      {
      printf("expected [%s], got [%s]\n", p->out, out.c_str());
      result = 1;
      }
    }
  return result;
}